

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O3

void __thiscall
wasm::Memory64Lowering::visitDataSegment(Memory64Lowering *this,DataSegment *segment)

{
  Expression *pEVar1;
  Module *this_00;
  char *pcVar2;
  size_t sVar3;
  Global *pGVar4;
  Module *pMVar5;
  Const *pCVar6;
  Global *curr;
  undefined1 local_c8 [8];
  ImportInfo info;
  Builder builder;
  
  if (segment->isPassive == false) {
    pEVar1 = segment->offset;
    if (pEVar1->_id == GlobalGetId) {
      this_00 = (this->
                super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
                currModule;
      pGVar4 = Module::getGlobal(this_00,(Name)pEVar1[1]);
      if (((pGVar4->super_Importable).module.super_IString.str._M_str != (char *)0x0) &&
         ((pGVar4->super_Importable).base.super_IString.str._M_str == _ZN4wasmL11MEMORY_BASEE_1)) {
        ImportInfo::ImportInfo((ImportInfo *)local_c8,this_00);
        pcVar2 = _DAT_00da7c70;
        sVar3 = MEMORY_BASE32;
        if (info.wasm !=
            (Module *)
            info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pMVar5 = info.wasm;
          do {
            curr = (Global *)
                   (pMVar5->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            if (((curr->super_Importable).module.super_IString.str._M_str ==
                 (pGVar4->super_Importable).module.super_IString.str._M_str) &&
               ((curr->super_Importable).base.super_IString.str._M_str == _DAT_00da7c70))
            goto LAB_007935e6;
            pMVar5 = (Module *)
                     &(pMVar5->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          } while (pMVar5 != (Module *)
                             info.importedGlobals.
                             super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                             _M_impl.super__Vector_impl_data._M_start);
        }
        info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
        pCVar6 = Builder::makeConst<int>
                           ((Builder *)
                            &info.importedTags.
                             super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,0);
        curr = (Global *)operator_new(0x50);
        (curr->super_Importable).base.super_IString.str._M_str = (char *)0x0;
        (curr->type).id = 0;
        curr->init = (Expression *)0x0;
        *(undefined8 *)&curr->mutable_ = 0;
        (curr->super_Importable).module.super_IString.str._M_str = (char *)0x0;
        (curr->super_Importable).base.super_IString.str._M_len = 0;
        *(undefined8 *)&(curr->super_Importable).super_Named.hasExplicitName = 0;
        (curr->super_Importable).module.super_IString.str._M_len = 0;
        (curr->super_Importable).super_Named.name.super_IString.str._M_len = sVar3;
        (curr->super_Importable).super_Named.name.super_IString.str._M_str = pcVar2;
        (curr->type).id = 2;
        curr->init = (Expression *)pCVar6;
        pcVar2 = (pGVar4->super_Importable).module.super_IString.str._M_str;
        (curr->super_Importable).module.super_IString.str._M_len =
             (pGVar4->super_Importable).module.super_IString.str._M_len;
        (curr->super_Importable).module.super_IString.str._M_str = pcVar2;
        pcVar2 = _DAT_00da7c70;
        (curr->super_Importable).base.super_IString.str._M_len = MEMORY_BASE32;
        (curr->super_Importable).base.super_IString.str._M_str = pcVar2;
        Module::addGlobal(this_00,curr);
LAB_007935e6:
        (pEVar1->type).id = 2;
        pcVar2 = (curr->super_Importable).super_Named.name.super_IString.str._M_str;
        *(size_t *)(pEVar1 + 1) = (curr->super_Importable).super_Named.name.super_IString.str._M_len
        ;
        pEVar1[1].type.id = (uintptr_t)pcVar2;
        if (info.importedMemories.
            super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(info.importedMemories.
                          super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)info.importedTags.
                                super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)info.importedMemories.
                                super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (info.importedTables.super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(info.importedTables.
                          super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                          (long)info.importedMemories.
                                super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)info.importedTables.
                                super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (info.importedFunctions.
            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(info.importedFunctions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)info.importedTables.
                                super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)info.importedFunctions.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(info.importedGlobals.
                          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)info.importedFunctions.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)info.importedGlobals.
                                super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (info.wasm != (Module *)0x0) {
          operator_delete(info.wasm,
                          (long)info.importedGlobals.
                                super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)info.wasm);
        }
      }
    }
    else if (pEVar1->_id == ConstId) {
      if (*(long *)(pEVar1 + 2) != 3) {
        __assert_fail("type == Type::i64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x121,"int64_t wasm::Literal::geti64() const");
      }
      local_c8._0_4_ = pEVar1[1]._id;
      info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
      Literal::operator=((Literal *)(pEVar1 + 1),(Literal *)local_c8);
      Literal::~Literal((Literal *)local_c8);
      (pEVar1->type).id = 2;
    }
  }
  return;
}

Assistant:

void visitDataSegment(DataSegment* segment) {
    if (!segment->isPassive) {
      if (auto* c = segment->offset->dynCast<Const>()) {
        c->value = Literal(static_cast<uint32_t>(c->value.geti64()));
        c->type = Type::i32;
      } else if (auto* get = segment->offset->dynCast<GlobalGet>()) {
        auto& module = *getModule();
        auto* g = module.getGlobal(get->name);
        if (g->imported() && g->base == MEMORY_BASE) {
          ImportInfo info(module);
          auto* memoryBase32 = info.getImportedGlobal(g->module, MEMORY_BASE32);
          if (!memoryBase32) {
            Builder builder(module);
            memoryBase32 = builder
                             .makeGlobal(MEMORY_BASE32,
                                         Type::i32,
                                         builder.makeConst(int32_t(0)),
                                         Builder::Immutable)
                             .release();
            memoryBase32->module = g->module;
            memoryBase32->base = MEMORY_BASE32;
            module.addGlobal(memoryBase32);
          }
          // Use this alternative import when initializing the segment.
          assert(memoryBase32);
          get->type = Type::i32;
          get->name = memoryBase32->name;
        }
      }
    }
  }